

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O0

BOOL Js::JavascriptArray::GetParamForIndexOf<unsigned_long>
               (unsigned_long length,Arguments *args,Var *search,unsigned_long *fromIndex,
               ScriptContext *scriptContext)

{
  Var pvVar1;
  unsigned_long uVar2;
  JavascriptLibrary *this;
  RecyclableObject *local_40;
  ScriptContext *scriptContext_local;
  unsigned_long *fromIndex_local;
  Var *search_local;
  Arguments *args_local;
  unsigned_long length_local;
  
  if (length == 0) {
    length_local._4_4_ = 0;
  }
  else {
    if ((SUB84(args->Info,0) & 0xffffff) < 3) {
      *fromIndex = 0;
      if ((SUB84(args->Info,0) & 0xffffff) == 1 || ((ulong)args->Info & 0xffffff) == 0) {
        this = ScriptContext::GetLibrary(scriptContext);
        local_40 = JavascriptLibraryBase::GetUndefined(&this->super_JavascriptLibraryBase);
      }
      else {
        local_40 = (RecyclableObject *)Arguments::operator[](args,1);
      }
      *search = local_40;
    }
    else {
      pvVar1 = Arguments::operator[](args,2);
      uVar2 = GetFromIndex<unsigned_long>(pvVar1,length,scriptContext,true);
      *fromIndex = uVar2;
      if (length <= *fromIndex) {
        return 0;
      }
      pvVar1 = Arguments::operator[](args,1);
      *search = pvVar1;
    }
    length_local._4_4_ = 1;
  }
  return length_local._4_4_;
}

Assistant:

BOOL JavascriptArray::GetParamForIndexOf(T length, Arguments const& args, Var& search, T& fromIndex, ScriptContext * scriptContext)
    {
        if (length == 0)
        {
            return false;
        }

        if (args.Info.Count > 2)
        {
            fromIndex = GetFromIndex(args[2], length, scriptContext);
            if (fromIndex >= length)
            {
                return false;
            }
            search = args[1];
        }
        else
        {
            fromIndex = 0;
            search = args.Info.Count > 1 ? args[1] : scriptContext->GetLibrary()->GetUndefined();
        }
        return true;
    }